

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

bool __thiscall flatbuffers::EnumDef::Deserialize(EnumDef *this,Parser *parser,Enum *_enum)

{
  Enum *pEVar1;
  bool bVar2;
  uint uVar3;
  String *this_00;
  Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int> *pVVar4;
  EnumVal *this_01;
  return_type val_00;
  Type *type;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  EnumVal *val;
  uoffset_t i;
  string local_68;
  string local_48;
  Enum *local_28;
  Enum *_enum_local;
  Parser *parser_local;
  EnumDef *this_local;
  
  local_28 = _enum;
  _enum_local = (Enum *)parser;
  parser_local = (Parser *)this;
  this_00 = reflection::Enum::name(_enum);
  String::str_abi_cxx11_(&local_68,this_00);
  Parser::UnqualifiedName(&local_48,parser,&local_68);
  std::__cxx11::string::operator=((string *)this,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  val._0_4_ = 0;
  while( true ) {
    pVVar4 = reflection::Enum::values(local_28);
    uVar3 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::size(pVVar4);
    if (uVar3 <= (uint)val) {
      bVar2 = reflection::Enum::is_union(local_28);
      pEVar1 = _enum_local;
      this->is_union = bVar2;
      type = reflection::Enum::underlying_type(local_28);
      bVar2 = Type::Deserialize(&this->underlying_type,(Parser *)pEVar1,type);
      pEVar1 = _enum_local;
      if (bVar2) {
        attrs = reflection::Enum::attributes(local_28);
        bVar2 = Definition::DeserializeAttributes(&this->super_Definition,(Parser *)pEVar1,attrs);
        if (bVar2) {
          documentation = reflection::Enum::documentation(local_28);
          anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
      return this_local._7_1_;
    }
    this_01 = (EnumVal *)operator_new(0xa8);
    EnumVal::EnumVal(this_01);
    pEVar1 = _enum_local;
    pVVar4 = reflection::Enum::values(local_28);
    val_00 = Vector<flatbuffers::Offset<reflection::EnumVal>,_unsigned_int>::Get(pVVar4,(uint)val);
    bVar2 = EnumVal::Deserialize(this_01,(Parser *)pEVar1,val_00);
    if ((!bVar2) ||
       (bVar2 = SymbolTable<flatbuffers::EnumVal>::Add(&this->vals,(string *)this_01,this_01), bVar2
       )) break;
    val._0_4_ = (uint)val + 1;
  }
  if (this_01 != (EnumVal *)0x0) {
    EnumVal::~EnumVal(this_01);
    operator_delete(this_01,0xa8);
  }
  return false;
}

Assistant:

bool EnumDef::Deserialize(Parser &parser, const reflection::Enum *_enum) {
  name = parser.UnqualifiedName(_enum->name()->str());
  for (uoffset_t i = 0; i < _enum->values()->size(); ++i) {
    auto val = new EnumVal();
    if (!val->Deserialize(parser, _enum->values()->Get(i)) ||
        vals.Add(val->name, val)) {
      delete val;
      return false;
    }
  }
  is_union = _enum->is_union();
  if (!underlying_type.Deserialize(parser, _enum->underlying_type())) {
    return false;
  }
  if (!DeserializeAttributes(parser, _enum->attributes())) return false;
  DeserializeDoc(doc_comment, _enum->documentation());
  return true;
}